

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderList.h
# Opt level: O0

void __thiscall FIX42::NewOrderList::NoOrders::NoOrders(NoOrders *this)

{
  undefined4 local_298 [2];
  undefined4 local_290;
  undefined4 local_288;
  undefined4 local_280;
  undefined4 local_278;
  undefined4 local_270;
  undefined4 local_268;
  undefined4 local_260;
  undefined4 local_258;
  undefined4 local_250;
  undefined4 local_248;
  undefined4 local_240;
  undefined4 local_238;
  undefined4 local_230;
  undefined4 local_228;
  undefined4 local_220;
  undefined4 local_218;
  undefined4 local_210;
  undefined4 local_208;
  undefined4 local_200;
  undefined4 local_1f8;
  undefined4 local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a0;
  undefined4 local_198;
  undefined4 local_190;
  undefined4 local_188;
  undefined4 local_180;
  undefined4 local_178;
  undefined4 local_170;
  undefined4 local_168;
  undefined4 local_160;
  undefined4 local_158;
  undefined4 local_150;
  undefined4 local_148;
  undefined4 local_140;
  undefined4 local_138;
  undefined4 local_130;
  undefined4 local_128;
  undefined4 local_120;
  undefined4 local_118;
  undefined4 local_110;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined1 *local_60;
  Group *local_58;
  int local_4c;
  message_order *local_48;
  message_order local_30;
  NoOrders *local_10;
  NoOrders *this_local;
  
  local_60 = (undefined1 *)local_298;
  local_70 = 0;
  local_78 = 0x1b8;
  local_80 = 0x1b7;
  local_88 = 0x185;
  local_90 = 0x184;
  local_98 = 0xd3;
  local_a0 = 0xd2;
  local_a8 = 0xcc;
  local_b0 = 0xcb;
  local_b8 = 0x4d;
  local_c0 = 0xc0;
  local_c8 = 0xc1;
  local_d0 = 0x163;
  local_d8 = 0x162;
  local_e0 = 0x3a;
  local_e8 = 0x78;
  local_f0 = 0x79;
  local_f8 = 0x2f;
  local_100 = 0xd;
  local_108 = 0xc;
  local_110 = 0x1ab;
  local_118 = 0x7e;
  local_120 = 0x1b0;
  local_128 = 0xa8;
  local_130 = 0x3b;
  local_138 = 0x75;
  local_140 = 0x17;
  local_148 = 0x179;
  local_150 = 0x178;
  local_158 = 0xf;
  local_160 = 99;
  local_168 = 0x2c;
  local_170 = 0x28;
  local_178 = 0x98;
  local_180 = 0x26;
  local_188 = 0x3c;
  local_190 = 0x72;
  local_198 = 0x191;
  local_1a0 = 0x36;
  local_1a8 = 0x8c;
  local_1b0 = 0x15f;
  local_1b8 = 0x15e;
  local_1c0 = 0x6b;
  local_1c8 = 0x15d;
  local_1d0 = 0x15c;
  local_1d8 = 0x6a;
  local_1e0 = 0xcf;
  local_1e8 = 0xdf;
  local_1f0 = 0xe7;
  local_1f8 = 0xce;
  local_200 = 0xca;
  local_208 = 0xc9;
  local_210 = 0xcd;
  local_218 = 200;
  local_220 = 0xa7;
  local_228 = 0x16;
  local_230 = 0x30;
  local_238 = 0x41;
  local_240 = 0x37;
  local_248 = 0x51;
  local_250 = 0x182;
  local_258 = 100;
  local_260 = 0x6f;
  local_268 = 0x6e;
  local_270 = 0x12;
  local_278 = 0x15;
  local_280 = 0x40;
  local_288 = 0x3f;
  local_290 = 0x4e;
  local_298[0] = 1;
  local_48 = &local_30;
  local_4c = 0xb;
  local_58 = &this->super_Group;
  local_10 = this;
  FIX::message_order::message_order(local_48,0xb,0x43,0xa0,0x6d,0x4c);
  FIX::Group::Group(local_58,0x49,local_4c,local_48);
  FIX::message_order::~message_order(&local_30);
  *(undefined ***)local_58 = &PTR__NoOrders_0045d9f0;
  return;
}

Assistant:

NoOrders() : FIX::Group(73,11,FIX::message_order(11,67,160,109,76,1,78,63,64,21,18,110,111,100,386,81,55,65,48,22,167,200,205,201,202,206,231,223,207,106,348,349,107,350,351,140,54,401,114,60,38,152,40,44,99,15,376,377,23,117,59,168,432,126,427,12,13,47,121,120,58,354,355,193,192,77,203,204,210,211,388,389,439,440,0)) {}